

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O3

int write_outgoing_bytes
              (TLS_IO_INSTANCE *tls_io_instance,ON_SEND_COMPLETE on_send_complete,
              void *callback_context)

{
  int iVar1;
  size_t __size;
  void *data;
  LOGGER_LOG p_Var2;
  
  __size = BIO_ctrl_pending((BIO *)tls_io_instance->out_bio);
  if (__size == 0) {
    iVar1 = 0;
  }
  else {
    data = malloc(__size);
    if (data == (void *)0x0) {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x2b3;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                  ,"write_outgoing_bytes",0x2b2,1,"NULL bytes_to_send.");
      }
    }
    else {
      iVar1 = BIO_read((BIO *)tls_io_instance->out_bio,data,(int)__size);
      if (iVar1 == (int)__size) {
        iVar1 = xio_send(tls_io_instance->underlying_io,data,__size,on_send_complete,
                         callback_context);
        if (iVar1 == 0) {
          iVar1 = 0;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          iVar1 = 0x2c1;
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                      ,"write_outgoing_bytes",0x2c0,1,"Error in xio_send.");
          }
        }
      }
      else {
        log_ERR_get_error("BIO_read not in pending state.");
        iVar1 = 0x2ba;
      }
      free(data);
    }
  }
  return iVar1;
}

Assistant:

static int write_outgoing_bytes(TLS_IO_INSTANCE* tls_io_instance, ON_SEND_COMPLETE on_send_complete, void* callback_context)
{
    int result;

    size_t pending = BIO_ctrl_pending(tls_io_instance->out_bio);

    if (pending == 0)
    {
        result = 0;
    }
    else
    {
        unsigned char* bytes_to_send = malloc(pending);
        if (bytes_to_send == NULL)
        {
            LogError("NULL bytes_to_send.");
            result = MU_FAILURE;
        }
        else
        {
            if (BIO_read(tls_io_instance->out_bio, bytes_to_send, (int)pending) != (int)pending)
            {
                log_ERR_get_error("BIO_read not in pending state.");
                result = MU_FAILURE;
            }
            else
            {
                if (xio_send(tls_io_instance->underlying_io, bytes_to_send, pending, on_send_complete, callback_context) != 0)
                {
                    LogError("Error in xio_send.");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }

            free(bytes_to_send);
        }
    }

    return result;
}